

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void translateColumnToCopy(Parse *pParse,int iStart,int iTabCur,int iRegister,int bIncrRowid)

{
  int iVar1;
  VdbeOp *pVVar2;
  int *piVar3;
  
  if (pParse->db->mallocFailed == '\0') {
    iVar1 = pParse->pVdbe->nOp;
    pVVar2 = sqlite3VdbeGetOp(pParse->pVdbe,iStart);
    piVar3 = &pVVar2->p3;
    for (; iStart < iVar1; iStart = iStart + 1) {
      if (piVar3[-2] == iTabCur) {
        if (((VdbeOp *)(piVar3 + -3))->opcode == 0x81) {
          if (bIncrRowid == 0) {
            ((VdbeOp *)(piVar3 + -3))->opcode = 'I';
            piVar3[-2] = 0;
            goto LAB_00174621;
          }
          ((VdbeOp *)(piVar3 + -3))->opcode = 'S';
          piVar3[-2] = piVar3[-1];
          piVar3[-1] = 1;
        }
        else if (((VdbeOp *)(piVar3 + -3))->opcode == 'Z') {
          ((VdbeOp *)(piVar3 + -3))->opcode = 'N';
          piVar3[-2] = piVar3[-1] + iRegister;
          piVar3[-1] = *piVar3;
LAB_00174621:
          *piVar3 = 0;
        }
      }
      piVar3 = piVar3 + 6;
    }
  }
  return;
}

Assistant:

static void translateColumnToCopy(
  Parse *pParse,      /* Parsing context */
  int iStart,         /* Translate from this opcode to the end */
  int iTabCur,        /* OP_Column/OP_Rowid references to this table */
  int iRegister,      /* The first column is in this register */
  int bIncrRowid      /* If non-zero, transform OP_rowid to OP_AddImm(1) */
){
  Vdbe *v = pParse->pVdbe;
  VdbeOp *pOp = sqlite3VdbeGetOp(v, iStart);
  int iEnd = sqlite3VdbeCurrentAddr(v);
  if( pParse->db->mallocFailed ) return;
  for(; iStart<iEnd; iStart++, pOp++){
    if( pOp->p1!=iTabCur ) continue;
    if( pOp->opcode==OP_Column ){
      pOp->opcode = OP_Copy;
      pOp->p1 = pOp->p2 + iRegister;
      pOp->p2 = pOp->p3;
      pOp->p3 = 0;
    }else if( pOp->opcode==OP_Rowid ){
      if( bIncrRowid ){
        /* Increment the value stored in the P2 operand of the OP_Rowid. */
        pOp->opcode = OP_AddImm;
        pOp->p1 = pOp->p2;
        pOp->p2 = 1;
      }else{
        pOp->opcode = OP_Null;
        pOp->p1 = 0;
        pOp->p3 = 0;
      }
    }
  }
}